

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O2

RealType __thiscall OpenMD::StringTokenizer::nextTokenAsDouble(StringTokenizer *this)

{
  StringTokenizer *this_00;
  double dVar1;
  string token;
  _Alloc_hider local_28;
  
  this_00 = (StringTokenizer *)&stack0xffffffffffffffd8;
  nextToken_abi_cxx11_((string *)&stack0xffffffffffffffd8,this);
  convertFortranNumber(this_00,(string *)&stack0xffffffffffffffd8);
  dVar1 = atof(local_28._M_p);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return dVar1;
}

Assistant:

RealType StringTokenizer::nextTokenAsDouble() {
    std::string token = nextToken();
    convertFortranNumber(token);
    return atof(token.c_str());
  }